

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<float,2ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<float,_2UL> *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer pSVar4;
  pointer pSVar5;
  optional<std::array<float,_2UL>_> local_34;
  double local_28;
  
  if (v == (array<float,_2UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_value<std::array<float,2ul>>(&local_34,this);
    if (local_34.has_value_ == true) goto LAB_001d47ab;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = local_28;
    if (pSVar4 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar4) {
    bVar2 = tinyusdz::value::TimeSamples::get<std::array<float,_2UL>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((((this->_blocked == false) &&
       (pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
      ((uVar3 = (*pvVar1->type_id)(), uVar3 == 0 ||
       ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) ||
     (get_value<std::array<float,2ul>>(&local_34,this), local_34.has_value_ == false)) {
    return false;
  }
LAB_001d47ab:
  *(storage_t<std::array<float,_2UL>_> *)v->_M_elems = local_34.contained;
  return true;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }